

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_unpacklo_s8_s16(c_v256 a)

{
  c_v256 cVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  c_v256 *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar2 = vpermq_avx2((undefined1  [32])a,0x50);
  auVar5 = vpsllvq_avx2(auVar2,_DAT_00bf17c0);
  auVar3 = vpsllvq_avx2(auVar2,_DAT_00bf17e0);
  auVar7 = vpsllvq_avx2(auVar2,_DAT_00bf1800);
  auVar4 = vpsllq_avx((undefined1  [16])a.v128[0],0x28);
  auVar7 = vpshufd_avx2(auVar7,0xf5);
  auVar5 = vpsrlvq_avx2(auVar5,_DAT_00bf1820);
  auVar6 = vpsrad_avx2(auVar7,0x18);
  auVar7._16_16_ = _DAT_00bf1af0;
  auVar7._0_16_ = _DAT_00bf1af0;
  auVar7 = vpsubq_avx2(auVar5 ^ auVar7,auVar7);
  auVar5 = vpermq_avx2(ZEXT1632(auVar4),0xd4);
  auVar2 = vpblendd_avx2(auVar5,auVar2,0xcc);
  auVar2 = vpsrlvq_avx2(auVar2,_DAT_00bf1840);
  auVar5._16_16_ = _DAT_00bf1b00;
  auVar5._0_16_ = _DAT_00bf1b00;
  auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar7 = vpblendw_avx2(auVar8,auVar7,0x48);
  auVar2 = vpsubq_avx2(auVar2 ^ auVar5,auVar5);
  auVar2 = vpblendw_avx2(auVar8,auVar2,0x84);
  auVar5 = vpshufd_avx2(auVar3,0xf5);
  auVar5 = vpsrad_avx2(auVar5,8);
  auVar5 = vpblendw_avx2(auVar8,auVar5,0x22);
  auVar7 = vpor_avx2(auVar7,auVar5);
  auVar7 = vpor_avx2(auVar7,auVar2);
  cVar1 = (c_v256)vpblendw_avx2(auVar7,auVar6,0x11);
  *in_RDI = cVar1;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpacklo_s8_s16(c_v256 a) {
  return c_v256_from_v128(c_v128_unpackhi_s8_s16(a.v128[0]),
                          c_v128_unpacklo_s8_s16(a.v128[0]));
}